

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  undefined1 local_28 [8];
  UnknownField field;
  
  local_28._4_4_ = 3;
  local_28._0_4_ = number;
  field._0_8_ = operator_new(0x20);
  *(long **)field._0_8_ = (long *)(field._0_8_ + 0x10);
  *(long *)(field._0_8_ + 8) = 0;
  *(undefined1 *)(field._0_8_ + 0x10) = 0;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(&this->fields_,(value_type *)local_28);
  return (string *)field._0_8_;
}

Assistant:

std::string* UnknownFieldSet::AddLengthDelimited(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_LENGTH_DELIMITED);
  field.data_.length_delimited_.string_value = new std::string;
  fields_.push_back(field);
  return field.data_.length_delimited_.string_value;
}